

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_analysis.cc
# Opt level: O2

void __thiscall
pass_check_combinational_loop_Test::TestBody(pass_check_combinational_loop_Test *this)

{
  bool bVar1;
  Generator *this_00;
  Var *this_01;
  Const *var;
  undefined1 local_198 [8];
  Context c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  Message local_68 [4];
  AssertHelper local_48;
  undefined1 local_40 [32];
  
  kratos::Context::Context((Context *)local_198);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,"mod",(allocator<char> *)local_68);
  this_00 = kratos::Context::generator((Context *)local_198,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,"a",(allocator<char> *)local_68);
  this_01 = kratos::Generator::var(this_00,(string *)local_40,1);
  std::__cxx11::string::~string((string *)local_40);
  var = kratos::Const::constant(1,1,false);
  kratos::Var::operator+(this_01,&var->super_Var);
  kratos::Var::assign((Var *)local_40,this_01);
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)local_40._0_8_;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_;
  local_40._0_8_ = (pointer)0x0;
  local_40._8_8_ = (pointer)0x0;
  kratos::Generator::add_stmt
            (this_00,(shared_ptr<kratos::Stmt> *)&c.tracked_generators_._M_h._M_single_bucket);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  kratos::fix_assignment_type(this_00);
  local_40._0_8_ = local_40 + 0x10;
  local_40._16_8_ = 0;
  local_40._24_8_ = 0;
  local_40._8_8_ = (pointer)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    kratos::check_combinational_loop(this_00);
  }
  std::__cxx11::string::assign(local_40);
  testing::Message::Message(local_68);
  testing::internal::AssertHelper::AssertHelper
            (&local_48,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_analysis.cc"
             ,0x7c,(char *)local_40._0_8_);
  testing::internal::AssertHelper::operator=(&local_48,local_68);
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if (local_68[0].ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_68[0].ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  std::__cxx11::string::~string((string *)local_40);
  kratos::Context::~Context((Context *)local_198);
  return;
}

Assistant:

TEST(pass, check_combinational_loop) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto &a = mod.var("a", 1);
    mod.add_stmt(a.assign(a + constant(1, 1)));
    fix_assignment_type(&mod);

    EXPECT_THROW(check_combinational_loop(&mod), StmtException);
}